

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O2

IntrinsicResult intrinsic_basename(Context *context,IntrinsicResult partialResult)

{
  char *pcVar1;
  char *c;
  Value local_78;
  Value path;
  String result;
  String pathStr;
  Value local_38;
  String local_28;
  
  MiniScript::String::String(&local_28,"path");
  MiniScript::Context::GetVar((Context *)&path,(String *)partialResult.rs,(LocalOnlyMode)&local_28);
  MiniScript::String::release(&local_28);
  if (path.type == Null) {
    MiniScript::Value::Value(&local_38,(Value *)MiniScript::Value::zero);
    MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_38,true);
    MiniScript::Value::~Value(&local_38);
  }
  else {
    MiniScript::Value::ToString((Value *)&pathStr,(Machine *)&path);
    if (pathStr.ss == (StringStorage *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pathStr.ss)->data;
    }
    pcVar1 = strdup(pcVar1);
    c = __xpg_basename(pcVar1);
    MiniScript::String::String(&result,c);
    free(pcVar1);
    local_78.type = String;
    local_78.noInvoke = false;
    local_78.localOnly = Off;
    if (result.ss == (StringStorage *)0x0) {
      result.ss = (StringStorage *)MiniScript::Value::emptyString._8_8_;
    }
    if (result.ss != (StringStorage *)0x0) {
      ((result.ss)->super_RefCountedStorage).refCount =
           ((result.ss)->super_RefCountedStorage).refCount + 1;
    }
    local_78.data = (anon_union_8_3_2f476f46_for_data)result.ss;
    MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_78,true);
    MiniScript::Value::~Value(&local_78);
    MiniScript::String::release(&result);
    MiniScript::String::release(&pathStr);
  }
  MiniScript::Value::~Value(&path);
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_basename(Context *context, IntrinsicResult partialResult) {
	Value path = context->GetVar("path");
	if (path.IsNull()) return IntrinsicResult(Value::zero);
	String pathStr = path.ToString();
	#if _WIN32 || _WIN64
		char driveBuf[3];
		char nameBuf[256];
		char extBuf[256];
		_splitpath_s(pathStr.c_str(), driveBuf, sizeof(driveBuf), nullptr, 0, nameBuf, sizeof(nameBuf), extBuf, sizeof(extBuf));
		String result = String(nameBuf) + String(extBuf);
	#elif defined(__APPLE__) || defined(__FreeBSD__)
		String result(basename((char*)pathStr.c_str()));
	#else
		char *duplicate = strdup((char*)pathStr.c_str());
		String result(basename(duplicate));
		free(duplicate);
	#endif
	return IntrinsicResult(result);
}